

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool __thiscall
testing::internal::TypedTestSuitePState::AddTestName
          (TypedTestSuitePState *this,char *file,int line,char *case_name,char *test_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FILE *__stream;
  allocator<char> local_79;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  CodeLocation local_50;
  
  __stream = _stderr;
  local_78 = test_name;
  if (this->registered_ != true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,file,&local_79);
    paVar1 = &local_50.file.field_2;
    if (local_70 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_60) {
      local_50.file.field_2._8_8_ = uStack_58;
      local_50.file._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_50.file._M_dataplus._M_p = (pointer)local_70;
    }
    local_50.file.field_2._M_allocated_capacity._1_7_ = uStack_5f;
    local_50.file.field_2._M_local_buf[0] = local_60;
    local_50.file._M_string_length = local_68;
    local_68 = 0;
    local_60 = '\0';
    local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&local_60;
    local_50.line = line;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>,std::_Select1st<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>>
    ::_M_emplace_unique<char_const*&,testing::internal::CodeLocation>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>,std::_Select1st<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>>
                *)&this->registered_tests_,&local_78,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.file._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.file._M_dataplus._M_p,local_50.file.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_70 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    return true;
  }
  FormatFileLocation_abi_cxx11_
            (&local_50.file,(internal *)file,(char *)(ulong)(uint)line,(int)case_name);
  fprintf(__stream,"%s Test %s must be defined before REGISTER_TYPED_TEST_SUITE_P(%s, ...).\n",
          local_50.file._M_dataplus._M_p,local_78,case_name);
  std::__cxx11::string::~string((string *)&local_50);
  fflush(_stderr);
  posix::Abort();
}

Assistant:

bool AddTestName(const char* file, int line, const char* case_name,
                   const char* test_name) {
    if (registered_) {
      fprintf(stderr,
              "%s Test %s must be defined before "
              "REGISTER_TYPED_TEST_SUITE_P(%s, ...).\n",
              FormatFileLocation(file, line).c_str(), test_name, case_name);
      fflush(stderr);
      posix::Abort();
    }
    registered_tests_.emplace(test_name, CodeLocation(file, line));
    return true;
  }